

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# external_signer_scriptpubkeyman.cpp
# Opt level: O2

bool __thiscall
wallet::ExternalSignerScriptPubKeyMan::SetupDescriptor
          (ExternalSignerScriptPubKeyMan *this,WalletBatch *batch,
          unique_ptr<Descriptor,_std::default_delete<Descriptor>_> desc)

{
  WalletDescriptor *this_00;
  long lVar1;
  WalletStorage *pWVar2;
  uint __line;
  bool bVar3;
  int iVar4;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var5;
  runtime_error *this_01;
  char *__assertion;
  long in_FS_OFFSET;
  shared_ptr<Descriptor> descriptor;
  int32_t in_stack_fffffffffffffe78;
  allocator<char> local_181;
  element_type local_180;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_178;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  WalletDescriptor w_desc;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (&criticalblock2,&(this->super_DescriptorScriptPubKeyMan).cs_desc_man,"cs_desc_man",
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/external_signer_scriptpubkeyman.cpp"
             ,0x1a,false);
  pWVar2 = (this->super_DescriptorScriptPubKeyMan).super_ScriptPubKeyMan.m_storage;
  iVar4 = (*pWVar2->_vptr_WalletStorage[4])(pWVar2,0x400000000);
  if ((char)iVar4 == '\0') {
    __assertion = "m_storage.IsWalletFlagSet(WALLET_FLAG_DESCRIPTORS)";
    __line = 0x1b;
  }
  else {
    pWVar2 = (this->super_DescriptorScriptPubKeyMan).super_ScriptPubKeyMan.m_storage;
    iVar4 = (*pWVar2->_vptr_WalletStorage[4])(pWVar2,0x800000000);
    if ((char)iVar4 != '\0') {
      _Var5._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)GetTime();
      std::__shared_ptr<Descriptor,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<Descriptor,std::default_delete<Descriptor>,void>
                ((__shared_ptr<Descriptor,(__gnu_cxx::_Lock_policy)2> *)&local_180,
                 (unique_ptr<Descriptor,_std::default_delete<Descriptor>_> *)
                 desc._M_t.super___uniq_ptr_impl<Descriptor,_std::default_delete<Descriptor>_>._M_t.
                 super__Tuple_impl<0UL,_Descriptor_*,_std::default_delete<Descriptor>_>.
                 super__Head_base<0UL,_Descriptor_*,_false>._M_head_impl);
      descriptor.super___shared_ptr<Descriptor,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           _Var5._M_pi;
      descriptor.super___shared_ptr<Descriptor,_(__gnu_cxx::_Lock_policy)2>._M_ptr = &local_180;
      WalletDescriptor::WalletDescriptor(&w_desc,descriptor,0,0,0,in_stack_fffffffffffffe78);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_178);
      this_00 = &(this->super_DescriptorScriptPubKeyMan).m_wallet_descriptor;
      WalletDescriptor::operator=(this_00,&w_desc);
      (*(this->super_DescriptorScriptPubKeyMan).super_ScriptPubKeyMan._vptr_ScriptPubKeyMan[0x1a])
                (&local_140,this);
      bVar3 = WalletBatch::WriteDescriptor(batch,(uint256 *)&local_140,this_00);
      if (bVar3) {
        DescriptorScriptPubKeyMan::TopUpWithDB(&this->super_DescriptorScriptPubKeyMan,batch,0);
        pWVar2 = (this->super_DescriptorScriptPubKeyMan).super_ScriptPubKeyMan.m_storage;
        (*pWVar2->_vptr_WalletStorage[5])(pWVar2,batch);
        WalletDescriptor::~WalletDescriptor(&w_desc);
        std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock2.super_unique_lock);
        if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
          return true;
        }
      }
      else {
        this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_160,"SetupDescriptor",&local_181);
        std::operator+(&local_140,&local_160,": writing descriptor failed");
        std::runtime_error::runtime_error(this_01,(string *)&local_140);
        if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
          __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
      }
      __stack_chk_fail();
    }
    __assertion = "m_storage.IsWalletFlagSet(WALLET_FLAG_EXTERNAL_SIGNER)";
    __line = 0x1c;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/external_signer_scriptpubkeyman.cpp"
                ,__line,
                "bool wallet::ExternalSignerScriptPubKeyMan::SetupDescriptor(WalletBatch &, std::unique_ptr<Descriptor>)"
               );
}

Assistant:

bool ExternalSignerScriptPubKeyMan::SetupDescriptor(WalletBatch& batch, std::unique_ptr<Descriptor> desc)
{
    LOCK(cs_desc_man);
    assert(m_storage.IsWalletFlagSet(WALLET_FLAG_DESCRIPTORS));
    assert(m_storage.IsWalletFlagSet(WALLET_FLAG_EXTERNAL_SIGNER));

    int64_t creation_time = GetTime();

    // Make the descriptor
    WalletDescriptor w_desc(std::move(desc), creation_time, 0, 0, 0);
    m_wallet_descriptor = w_desc;

    // Store the descriptor
    if (!batch.WriteDescriptor(GetID(), m_wallet_descriptor)) {
        throw std::runtime_error(std::string(__func__) + ": writing descriptor failed");
    }

    // TopUp
    TopUpWithDB(batch);

    m_storage.UnsetBlankWalletFlag(batch);
    return true;
}